

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

UdpBodySyntax * __thiscall slang::parsing::Parser::parseUdpBody(Parser *this,bool isSequential)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  UdpPortDeclSyntax *pUVar4;
  ExpressionSyntax *value;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UdpBodySyntax *pUVar5;
  EVP_PKEY_CTX *src;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *portDecls_00;
  Token initial;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  Token table;
  bool isSequential_local;
  Info *local_1a0;
  UdpInitialStmtSyntax *local_198;
  Info *local_190;
  Token local_188;
  Token local_178;
  Token local_168;
  SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL> entries;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> local_118;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> portDecls;
  SyntaxList<slang::syntax::UdpEntrySyntax> local_68;
  
  portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  isSequential_local = isSequential;
  while( true ) {
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = syntax::SyntaxFacts::isPossibleUdpPort(TVar6.kind);
    if (!bVar1) break;
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    pUVar4 = parseUdpPortDecl(this,&isSequential_local);
    entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.data_ = (pointer)pUVar4;
    entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.cap =
         CONCAT71(entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.cap._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&entries);
    entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>._0_16_ =
         ParserBase::expect(&this->super_ParserBase,Semicolon);
    entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.cap =
         entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.cap & 0xffffffffffffff00;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&entries);
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    if (TVar6.info == TVar7.info && TVar6.kind == TVar7.kind) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
    }
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,InitialKeyword);
  if (bVar1) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    local_1a0 = TVar6.info;
    local_198 = TVar6._0_8_;
    TVar6 = ParserBase::expect(&this->super_ParserBase,Identifier);
    TVar7 = ParserBase::expect(&this->super_ParserBase,Equals);
    value = parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    local_178 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    initial.info = local_1a0;
    initial._0_8_ = local_198;
    local_168 = TVar7;
    local_198 = syntax::SyntaxFactory::udpInitialStmt
                          (&this->factory,initial,TVar6,TVar7,value,local_178);
  }
  else {
    local_198 = (UdpInitialStmtSyntax *)0x0;
  }
  TVar6 = ParserBase::expect(&this->super_ParserBase,TableKeyword);
  entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.len = 0;
  entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.data_ =
       (pointer)entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.firstElement;
  entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>.cap = 5;
  bVar1 = (bool)(isSequential_local & 1);
  while( true ) {
    local_190 = TVar6.info;
    local_1a0 = TVar6._0_8_;
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = syntax::SyntaxFacts::isPossibleUdpEntry(TVar6.kind);
    if (!bVar2) break;
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    local_118.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)parseUdpEntry(this,bVar1);
    SmallVectorBase<slang::syntax::UdpEntrySyntax*>::emplace_back<slang::syntax::UdpEntrySyntax*>
              ((SmallVectorBase<slang::syntax::UdpEntrySyntax*> *)&entries,
               (UdpEntrySyntax **)&local_118);
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    TVar6.info = local_190;
    TVar6._0_8_ = local_1a0;
    if (TVar7.info == TVar8.info && TVar7.kind == TVar8.kind) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      TVar6.info = local_190;
      TVar6._0_8_ = local_1a0;
    }
  }
  TVar6 = ParserBase::expect(&this->super_ParserBase,EndTableKeyword);
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar6.info);
  local_118.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  local_118.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_118.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002da7f8;
  iVar3 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::copy
                    (&entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_68.super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var_00,iVar3);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dbf50;
  portDecls_00 = &local_118;
  table.info = local_190;
  table._0_8_ = local_1a0;
  local_188 = TVar6;
  pUVar5 = syntax::SyntaxFactory::udpBody
                     (&this->factory,portDecls_00,local_198,table,&local_68,TVar6);
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::cleanup
            (&entries.super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>,
             (EVP_PKEY_CTX *)portDecls_00);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&portDecls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)portDecls_00);
  return pUVar5;
}

Assistant:

UdpBodySyntax& Parser::parseUdpBody(bool isSequential) {
    SmallVector<TokenOrSyntax, 4> portDecls;
    while (isPossibleUdpPort(peek().kind)) {
        auto current = peek();
        portDecls.push_back(&parseUdpPortDecl(isSequential));
        portDecls.push_back(expect(TokenKind::Semicolon));

        if (current == peek()) {
            // We didn't consume any tokens, so we're looking at
            // something invalid.
            skipToken({});
        }
    }

    UdpInitialStmtSyntax* initial = nullptr;
    if (peek(TokenKind::InitialKeyword)) {
        auto keyword = consume();
        auto name = expect(TokenKind::Identifier);
        auto equals = expect(TokenKind::Equals);
        auto& expr = parsePrimaryExpression(ExpressionOptions::None);
        auto semi = expect(TokenKind::Semicolon);
        initial = &factory.udpInitialStmt(keyword, name, equals, expr, semi);
    }

    auto table = expect(TokenKind::TableKeyword);

    SmallVector<UdpEntrySyntax*> entries;
    while (isPossibleUdpEntry(peek().kind)) {
        auto current = peek();
        entries.push_back(&parseUdpEntry(isSequential));

        if (current == peek()) {
            // We didn't consume any tokens, so we're looking at
            // something invalid.
            skipToken({});
        }
    }

    auto endtable = expect(TokenKind::EndTableKeyword);
    return factory.udpBody(portDecls.copy(alloc), initial, table, entries.copy(alloc), endtable);
}